

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

SegmentBTreeRoot * __thiscall Js::JavascriptArray::BuildSegmentMap(JavascriptArray *this)

{
  anon_class_16_2_560a2b8c fn;
  Recycler *pRVar1;
  SegmentBTreeRoot *this_00;
  TrackAllocData local_48;
  SegmentBTreeRoot *local_20;
  SegmentBTreeRoot *tmpSegmentMap;
  Recycler *recycler;
  JavascriptArray *this_local;
  
  recycler = (Recycler *)this;
  pRVar1 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  tmpSegmentMap = (SegmentBTreeRoot *)pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&SegmentBTreeRoot::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
             ,0xa6a);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (SegmentBTreeRoot *)new<Memory::Recycler>(0x28,pRVar1,0x446fd0);
  SegmentBTreeRoot::SegmentBTreeRoot(this_00);
  fn.tmpSegmentMap = this_00;
  fn.recycler = (Recycler *)tmpSegmentMap;
  local_20 = this_00;
  ForEachSegment<Js::JavascriptArray::BuildSegmentMap()::__0>(this,fn);
  SetSegmentMap(this,local_20);
  return local_20;
}

Assistant:

SegmentBTreeRoot * JavascriptArray::BuildSegmentMap()
    {
        Recycler* recycler = GetRecycler();
        SegmentBTreeRoot* tmpSegmentMap = AllocatorNewStruct(Recycler, recycler, SegmentBTreeRoot);
        ForEachSegment([recycler, tmpSegmentMap](SparseArraySegmentBase * current)
        {
            tmpSegmentMap->Add(recycler, current);
            return false;
        });

        // There could be OOM during building segment map. Save to array only after its successful completion.
        SetSegmentMap(tmpSegmentMap);
        return tmpSegmentMap;
    }